

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcess.cxx
# Opt level: O2

bool __thiscall
cmProcess::StartProcess
          (cmProcess *this,uv_loop_t *loop,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *affinity)

{
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  pointer ppcVar1;
  pointer pbVar2;
  cmCTest *pcVar3;
  pointer puVar4;
  int iVar5;
  rep rVar6;
  ostream *poVar7;
  char *pcVar8;
  uv_pipe_s *puVar9;
  pointer puVar10;
  uv_stream_t *stream;
  bool bVar11;
  string *arg;
  pointer pbVar12;
  uv_pipe_ptr pipe_reader;
  int fds [2];
  vector<char,_std::allocator<char>_> cpumask;
  uv_pipe_ptr pipe_writer;
  uv_process_options_t local_268;
  uv_timer_ptr timer;
  char *local_1f8 [4];
  uv_stdio_container_t stdio [3];
  ostringstream cmCTestLog_msg;
  
  this->ProcessState = Error;
  if ((this->Command)._M_string_length == 0) {
    return false;
  }
  rVar6 = std::chrono::_V2::steady_clock::now();
  (this->StartTime).__d.__r = rVar6;
  this_00 = &this->ProcessArgs;
  ppcVar1 = (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar1) {
    (this->ProcessArgs).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  _cmCTestLog_msg = (this->Command)._M_dataplus._M_p;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)this_00,(char **)&cmCTestLog_msg);
  pbVar2 = (this->Arguments).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar12 = (this->Arguments).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar12 != pbVar2; pbVar12 = pbVar12 + 1
      ) {
    _cmCTestLog_msg = (pbVar12->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)this_00,(char **)&cmCTestLog_msg);
  }
  _cmCTestLog_msg = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)this_00,(char **)&cmCTestLog_msg);
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  timer.super_uv_handle_ptr_<uv_timer_s>.super_uv_handle_ptr_base_<uv_timer_s>.handle.
  super___shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar5 = ::cm::uv_timer_ptr::init(&timer,(EVP_PKEY_CTX *)loop);
  if (iVar5 != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"Error initializing timer: ");
    pcVar8 = uv_strerror(iVar5);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar3 = ((this->Runner)._M_t.
              super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
              super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
              super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                 ,0x4a,(char *)local_268.exit_cb,false);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar11 = false;
    goto LAB_004a7947;
  }
  pipe_writer.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  pipe_writer.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pipe_reader.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  pipe_reader.super_uv_handle_ptr_<uv_pipe_s>.super_uv_handle_ptr_base_<uv_pipe_s>.handle.
  super___shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::cm::uv_pipe_ptr::init(&pipe_writer,(EVP_PKEY_CTX *)loop);
  ::cm::uv_pipe_ptr::init(&pipe_reader,(EVP_PKEY_CTX *)loop);
  fds[0] = -1;
  fds[1] = -1;
  iVar5 = cmGetPipes(fds);
  if (iVar5 == 0) {
    puVar9 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       (&pipe_reader.super_uv_handle_ptr_<uv_pipe_s>);
    uv_pipe_open(puVar9,fds[0]);
    puVar9 = ::cm::uv_handle_ptr_::operator_cast_to_uv_pipe_s_
                       (&pipe_writer.super_uv_handle_ptr_<uv_pipe_s>);
    uv_pipe_open(puVar9,fds[1]);
    stdio[0].flags = UV_INHERIT_FD;
    stdio[0].data.fd = 0;
    stdio[1].flags = UV_INHERIT_STREAM;
    stdio[1].data.stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&pipe_writer);
    stdio[2]._4_4_ = stdio[1]._4_4_;
    stdio[2].flags = stdio[1].flags;
    local_268.uid = 0;
    local_268.gid = 0;
    local_268.cpumask = (char *)0x0;
    local_268.cpumask_size = 0;
    local_268.env = (char **)0x0;
    local_268.cwd = (char *)0x0;
    local_268.file = (this->Command)._M_dataplus._M_p;
    local_268.args =
         (this_00->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_268.flags = 0;
    local_268.stdio_count = 3;
    local_268.exit_cb = OnExitCB;
    local_268.stdio = stdio;
    cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    stdio[2].data.stream = stdio[1].data.stream;
    if ((affinity == (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) ||
       ((affinity->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (affinity->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
        super__Vector_impl_data._M_finish)) {
      local_268.cpumask = (pointer)0x0;
      local_268.cpumask_size = 0;
    }
    else {
      iVar5 = uv_cpumask_size();
      _cmCTestLog_msg = (pointer)((ulong)_cmCTestLog_msg & 0xffffffffffffff00);
      std::vector<char,_std::allocator<char>_>::resize
                (&cpumask,(long)iVar5,(value_type *)&cmCTestLog_msg);
      puVar4 = (affinity->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      for (puVar10 = (affinity->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start; puVar10 != puVar4;
          puVar10 = puVar10 + 1) {
        cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[*puVar10] = '\x01';
      }
      local_268.cpumask =
           cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
      local_268.cpumask_size =
           (long)cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
    cpumask.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
         = local_268.cpumask;
    stream = ::cm::uv_pipe_ptr::operator_cast_to_uv_stream_s_(&pipe_reader);
    iVar5 = uv_read_start(stream,OnAllocateCB,OnReadCB);
    if (iVar5 == 0) {
      iVar5 = ::cm::uv_process_ptr::spawn(&this->Process,loop,&local_268,this);
      if (iVar5 != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"Process not started\n ");
        poVar7 = std::operator<<(poVar7,(string *)&this->Command);
        poVar7 = std::operator<<(poVar7,"\n[");
        pcVar8 = uv_strerror(iVar5);
        poVar7 = std::operator<<(poVar7,pcVar8);
        std::operator<<(poVar7,"]\n");
        pcVar3 = ((this->Runner)._M_t.
                  super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                  super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                  super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar3,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                     ,0x8c,local_1f8[0],false);
        goto LAB_004a790f;
      }
      std::__shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2> *)&this->PipeReader,
                 (__shared_ptr<uv_pipe_s,_(__gnu_cxx::_Lock_policy)2> *)&pipe_reader);
      std::__shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2> *)&this->Timer,
                 (__shared_ptr<uv_timer_s,_(__gnu_cxx::_Lock_policy)2> *)&timer);
      StartTimer(this);
      this->ProcessState = Executing;
      bVar11 = true;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"Error starting read events: ");
      pcVar8 = uv_strerror(iVar5);
      poVar7 = std::operator<<(poVar7,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      pcVar3 = ((this->Runner)._M_t.
                super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
                super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
                super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar3,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                   ,0x84,local_1f8[0],false);
LAB_004a790f:
      std::__cxx11::string::~string((string *)local_1f8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      bVar11 = false;
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&cpumask.super__Vector_base<char,_std::allocator<char>_>);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar7 = std::operator<<((ostream *)&cmCTestLog_msg,"Error initializing pipe: ");
    pcVar8 = uv_strerror(iVar5);
    poVar7 = std::operator<<(poVar7,pcVar8);
    std::endl<char,std::char_traits<char>>(poVar7);
    pcVar3 = ((this->Runner)._M_t.
              super___uniq_ptr_impl<cmCTestRunTest,_std::default_delete<cmCTestRunTest>_>._M_t.
              super__Tuple_impl<0UL,_cmCTestRunTest_*,_std::default_delete<cmCTestRunTest>_>.
              super__Head_base<0UL,_cmCTestRunTest_*,_false>._M_head_impl)->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmProcess.cxx"
                 ,0x59,(char *)local_268.exit_cb,false);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    bVar11 = false;
  }
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_pipe_s> *)&pipe_reader);
  ::cm::uv_handle_ptr_base_<uv_pipe_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_pipe_s> *)&pipe_writer);
LAB_004a7947:
  ::cm::uv_handle_ptr_base_<uv_timer_s>::~uv_handle_ptr_base_
            ((uv_handle_ptr_base_<uv_timer_s> *)&timer);
  return bVar11;
}

Assistant:

bool cmProcess::StartProcess(uv_loop_t& loop, std::vector<size_t>* affinity)
{
  this->ProcessState = cmProcess::State::Error;
  if (this->Command.empty()) {
    return false;
  }
  this->StartTime = std::chrono::steady_clock::now();
  this->ProcessArgs.clear();
  // put the command as arg0
  this->ProcessArgs.push_back(this->Command.c_str());
  // now put the command arguments in
  for (std::string const& arg : this->Arguments) {
    this->ProcessArgs.push_back(arg.c_str());
  }
  this->ProcessArgs.push_back(nullptr); // null terminate the list

  cm::uv_timer_ptr timer;
  int status = timer.init(loop, this);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error initializing timer: " << uv_strerror(status)
                                            << std::endl);
    return false;
  }

  cm::uv_pipe_ptr pipe_writer;
  cm::uv_pipe_ptr pipe_reader;

  pipe_writer.init(loop, 0);
  pipe_reader.init(loop, 0, this);

  int fds[2] = { -1, -1 };
  status = cmGetPipes(fds);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error initializing pipe: " << uv_strerror(status)
                                           << std::endl);
    return false;
  }

  uv_pipe_open(pipe_reader, fds[0]);
  uv_pipe_open(pipe_writer, fds[1]);

  uv_stdio_container_t stdio[3];
  stdio[0].flags = UV_INHERIT_FD;
  stdio[0].data.fd = 0;
  stdio[1].flags = UV_INHERIT_STREAM;
  stdio[1].data.stream = pipe_writer;
  stdio[2] = stdio[1];

  uv_process_options_t options = uv_process_options_t();
  options.file = this->Command.data();
  options.args = const_cast<char**>(this->ProcessArgs.data());
  options.stdio_count = 3; // in, out and err
  options.exit_cb = &cmProcess::OnExitCB;
  options.stdio = stdio;
#if !defined(CMAKE_USE_SYSTEM_LIBUV)
  std::vector<char> cpumask;
  if (affinity && !affinity->empty()) {
    cpumask.resize(static_cast<size_t>(uv_cpumask_size()), 0);
    for (auto p : *affinity) {
      cpumask[p] = 1;
    }
    options.cpumask = cpumask.data();
    options.cpumask_size = cpumask.size();
  } else {
    options.cpumask = nullptr;
    options.cpumask_size = 0;
  }
#else
  static_cast<void>(affinity);
#endif

  status =
    uv_read_start(pipe_reader, &cmProcess::OnAllocateCB, &cmProcess::OnReadCB);

  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Error starting read events: " << uv_strerror(status)
                                              << std::endl);
    return false;
  }

  status = this->Process.spawn(loop, options, this);
  if (status != 0) {
    cmCTestLog(this->Runner->GetCTest(), ERROR_MESSAGE,
               "Process not started\n " << this->Command << "\n["
                                        << uv_strerror(status) << "]\n");
    return false;
  }

  this->PipeReader = std::move(pipe_reader);
  this->Timer = std::move(timer);

  this->StartTimer();

  this->ProcessState = cmProcess::State::Executing;
  return true;
}